

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# https.c
# Opt level: O0

int http_write_end(HTTP_INFO *hi)

{
  int iVar1;
  int local_2c;
  int len;
  int ret;
  char str [10];
  HTTP_INFO *hi_local;
  
  if (hi == (HTTP_INFO *)0x0) {
    hi_local._4_4_ = -1;
  }
  else {
    str._2_8_ = hi;
    if ((hi->request).chunked == '\x01') {
      local_2c = snprintf((char *)((long)&len + 2),10,"0\r\n\r\n");
    }
    else {
      local_2c = snprintf((char *)((long)&len + 2),10,"\r\n\r\n");
    }
    iVar1 = https_write((HTTP_INFO *)str._2_8_,(char *)((long)&len + 2),local_2c);
    if (iVar1 == local_2c) {
      hi_local._4_4_ = local_2c;
    }
    else {
      https_close((HTTP_INFO *)str._2_8_);
      hi_local._4_4_ = -1;
      _error = iVar1;
    }
  }
  return hi_local._4_4_;
}

Assistant:

int http_write_end(HTTP_INFO *hi)
{
    char        str[10];
    int         ret, len;

    if (NULL == hi) return -1;

    if(hi->request.chunked == TRUE)
    {
        len = snprintf(str, 10, "0\r\n\r\n");
    }
    else
    {
        len = snprintf(str, 10, "\r\n\r\n");
    }

    if ((ret = https_write(hi, str, len)) != len)
    {
        https_close(hi);
        _error = ret;

        return -1;
    }

    return len;
}